

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMetaDataGetIntegers
              (FmsMetaData mdata,char **mdata_name,FmsIntType *int_type,FmsInt *size,void **data)

{
  if (mdata != (FmsMetaData)0x0) {
    if (mdata_name != (char **)0x0) {
      *mdata_name = mdata->name;
    }
    if (int_type != (FmsIntType *)0x0) {
      *int_type = (FmsIntType)mdata->sub_type;
    }
    if (size != (FmsInt *)0x0) {
      *size = mdata->num_entries;
    }
    if (data != (void **)0x0) {
      *data = mdata->data;
    }
    return 0;
  }
  return 1;
}

Assistant:

int FmsMetaDataGetIntegers(FmsMetaData mdata, const char **mdata_name,
                           FmsIntType *int_type, FmsInt *size,
                           const void **data) {
  if (!mdata) { E_RETURN(1); }
  if (mdata_name) { *mdata_name = mdata->name; }
  if (int_type) { *int_type = mdata->sub_type.int_type; }
  if (size) { *size = mdata->num_entries; }
  if (data) { *data = mdata->data; }
  return 0;
}